

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O1

void __thiscall Sinclair::ZX8081::Video::flush(Video *this,bool next_sync)

{
  int iVar1;
  int number_of_cycles;
  long lVar2;
  long lVar3;
  
  if (this->sync_ == true) {
    Outputs::CRT::CRT::output_sync
              (&this->crt_,(int)(this->time_since_update_).super_WrappedInt<HalfCycles>.length_);
  }
  else {
    if (this->line_data_ != (uint8_t *)0x0) {
      iVar1 = (int)(this->time_since_update_).super_WrappedInt<HalfCycles>.length_;
      number_of_cycles = *(int *)&this->line_data_pointer_ - (int)this->line_data_;
      if (iVar1 <= number_of_cycles && !next_sync) {
        return;
      }
      if (iVar1 < number_of_cycles) {
        number_of_cycles = iVar1;
      }
      Outputs::CRT::CRT::output_data(&this->crt_,number_of_cycles,(long)number_of_cycles);
      this->line_data_ = (uint8_t *)0x0;
      this->line_data_pointer_ = (uint8_t *)0x0;
      (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ =
           (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ - (long)number_of_cycles;
    }
    lVar3 = (this->time_since_update_).super_WrappedInt<HalfCycles>.length_;
    lVar2 = 0x7fffffff;
    if (lVar3 < 0x7fffffff) {
      lVar2 = lVar3;
    }
    lVar3 = -0x80000000;
    if (-0x80000000 < lVar2) {
      lVar3 = lVar2;
    }
    Outputs::CRT::CRT::output_level<unsigned_char>(&this->crt_,(int)lVar3,0xff);
  }
  (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  return;
}

Assistant:

void Video::flush(bool next_sync) {
	if(sync_) {
		// If in sync, that takes priority. Output the proper amount of sync.
		crt_.output_sync(int(time_since_update_.as_integral()));
	} else {
		// If not presently in sync, then...

		if(line_data_) {
			// If there is output data queued, output it either if it's being interrupted by
			// sync, or if we're past its end anyway. Otherwise let it be.
			int data_length = int(line_data_pointer_ - line_data_);
			if(data_length < int(time_since_update_.as_integral()) || next_sync) {
				auto output_length = std::min(data_length, int(time_since_update_.as_integral()));
				crt_.output_data(output_length);
				line_data_pointer_ = line_data_ = nullptr;
				time_since_update_ -= HalfCycles(output_length);
			} else return;
		}

		// Any pending pixels being dealt with, pad with the white level.
		crt_.output_level<uint8_t>(time_since_update_.as<int>(), 0xff);
	}

	time_since_update_ = 0;
}